

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_triangles_iterators.h
# Opt level: O3

void __thiscall
Gudhi::skeleton_blocker::
Triangle_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::increment(Triangle_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
            *this)

{
  Complex *pCVar1;
  Complex *pCVar2;
  bool bVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  
  if ((this->current_triangle_).is_end_ == false) {
    pCVar1 = (Complex *)
             (this->current_triangle_).link_.
             super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pCVar2 = (this->current_triangle_).current_edge_.complex;
    if (pCVar2 == pCVar1) {
      p_Var5 = (this->current_triangle_).current_edge_.edge_iterator.first.
               super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
               .m_iterator._M_node;
      p_Var4 = (this->current_triangle_).current_edge_.edge_iterator.second.
               super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
               .m_iterator._M_node;
      if ((Graph *)p_Var4 == &pCVar1->skeleton && (Graph *)p_Var5 == &pCVar1->skeleton)
      goto LAB_0012294c;
    }
    else {
      p_Var5 = (this->current_triangle_).current_edge_.edge_iterator.first.
               super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
               .m_iterator._M_node;
      p_Var4 = (this->current_triangle_).current_edge_.edge_iterator.second.
               super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
               .m_iterator._M_node;
    }
    p_Var6 = p_Var4;
    if (p_Var5 != p_Var4) {
      p_Var6 = p_Var5->_M_next;
      (this->current_triangle_).current_edge_.edge_iterator.first.
      super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
      .m_iterator._M_node = p_Var6;
    }
    if (((pCVar2 != pCVar1) || ((Graph *)p_Var6 != &pCVar1->skeleton)) ||
       ((Graph *)p_Var4 != &pCVar1->skeleton)) {
      return;
    }
  }
  else {
LAB_0012294c:
    bVar3 = is_finished(this);
    if (bVar3) {
      __assert_fail("!is_finished()",
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker/iterators/Skeleton_blockers_triangles_iterators.h"
                    ,0xc5,
                    "void Gudhi::skeleton_blocker::Triangle_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>>::increment() [SkeletonBlockerComplex = Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>]"
                   );
    }
  }
  goto_next_vertex(this);
  return;
}

Assistant:

void increment() {
    if (!current_triangle_.finished()) {
      ++current_triangle_;  // problem here
      if (current_triangle_.finished())
        goto_next_vertex();
    } else {
      assert(!is_finished());
      goto_next_vertex();
    }
  }